

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_unittest.cc
# Opt level: O3

void __thiscall
Sha1Hash_TestVectors_Test::~Sha1Hash_TestVectors_Test(Sha1Hash_TestVectors_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Sha1Hash, TestVectors) {
  SHA1_CTX context;
  uint8_t digest[20];

  static const char *test_data[] = {
    "abc",
    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
    "A million repetitions of 'a'"};

  static const char *test_results[] = {
    "A9993E36 4706816A BA3E2571 7850C26C 9CD0D89D",
    "84983E44 1C3BD26E BAAE4AA1 F95129E5 E54670F1",
    "34AA973C D4C4DAA4 F61EEB2B DBAD2731 6534016F"};

  for (int k = 0; k < 2; k++){
    SHA1_Init(&context);
    SHA1_Update(&context, (uint8_t*)test_data[k], strlen(test_data[k]));
    SHA1_Final(digest, &context);
    EXPECT_TRUE(IsEqual(test_data[k], digest, test_results[k]));
  }

  // million 'a' vector we feed separately
  SHA1_Init(&context);
  for (int k = 0; k < 1000000; k++)
    SHA1_Update(&context, (uint8_t*)"a", 1);
  SHA1_Final(digest, &context);
  EXPECT_TRUE(IsEqual(test_data[2], digest, test_results[2]));
}